

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

void Mvc_CoverSupport(Mvc_Cover_t *pCover,Mvc_Cube_t *pSupp)

{
  uint uVar1;
  int _i_;
  uint uVar2;
  Mvc_Cube_t *pMVar3;
  
  uVar1 = *(uint *)&pSupp->field_0x8 & 0xffffff;
  if (uVar1 == 0) {
    pSupp->pData[0] = 0;
  }
  else {
    uVar2 = uVar1;
    if (uVar1 == 1) {
      *(undefined8 *)pSupp->pData = 0;
    }
    else {
      for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
        pSupp->pData[uVar2] = 0;
      }
    }
  }
  pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
  while (pMVar3 = pMVar3->pNext, pMVar3 != (Mvc_Cube_t *)0x0) {
    if (uVar1 == 0) {
      pSupp->pData[0] = pSupp->pData[0] | pMVar3->pData[0];
    }
    else {
      uVar2 = uVar1;
      if (uVar1 == 1) {
        pSupp->pData[0] = pSupp->pData[0] | pMVar3->pData[0];
        *(uint *)&pSupp->field_0x14 = *(uint *)&pSupp->field_0x14 | *(uint *)&pMVar3->field_0x14;
      }
      else {
        for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
          pSupp->pData[uVar2] = pSupp->pData[uVar2] | pMVar3->pData[uVar2];
        }
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverSupport( Mvc_Cover_t * pCover, Mvc_Cube_t * pSupp )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitClean( pSupp );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitOr( pSupp, pSupp, pCube );
}